

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int num_vars,Type type)

{
  undefined8 *puVar1;
  SafeInt<int> local_3c;
  Var local_38;
  
  SafeInt<int>::SafeInt<unsigned_long>
            (&local_3c,
             (long)(this->vars_).
                   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->vars_).
                   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_3c.value_ < 0) {
    if (num_vars < -0x80000000 - local_3c.value_) goto LAB_00330f6d;
  }
  else if ((int)(local_3c.value_ ^ 0x7fffffffU) < num_vars) {
LAB_00330f6d:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_0044e3f8;
    __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
  }
  Var::Var(&local_38,0.0,0.0);
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
  ::resize(&this->vars_,(long)(local_3c.value_ + num_vars),&local_38);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->is_var_int_,(long)(local_3c.value_ + num_vars),type != CONTINUOUS);
  return;
}

Assistant:

void AddVars(int num_vars, var::Type type) {
    MP_ASSERT(num_vars >= 0, "invalid size");
    std::size_t new_size = val(SafeInt<int>(vars_.size()) + num_vars);
    vars_.resize(new_size, Var(0, 0));
    is_var_int_.resize(new_size, type != var::CONTINUOUS);
  }